

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringTest_ClearOnAliasReusesSpace_Test::
~MicroStringTest_ClearOnAliasReusesSpace_Test(MicroStringTest_ClearOnAliasReusesSpace_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MicroStringTest, ClearOnAliasReusesSpace) {
  Arena arena;
  MicroString str;
  str.SetAlias("Some arbitrary string to alias here.", &arena);
  const size_t available_space = kLargeRepSize - kMicroRepSize;
  const size_t used = arena.SpaceUsed();
  str.Clear();
  EXPECT_EQ(str.Get(), "");
  EXPECT_EQ(kLargeRepSize, str.SpaceUsedExcludingSelfLong());

  std::string input(available_space, 'a');
  // No new space.
  str.Set(input, &arena);
  EXPECT_EQ(used, arena.SpaceUsed());
  EXPECT_EQ(kLargeRepSize, str.SpaceUsedExcludingSelfLong());

  // Now we have to realloc
  str.Set(absl::StrCat(input, "A"), &arena);
  EXPECT_LT(used, arena.SpaceUsed());
  EXPECT_LT(kLargeRepSize, str.SpaceUsedExcludingSelfLong());
}